

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void __thiscall
HttpSession::on_write(HttpSession *this,bool close,error_code eCode,size_t bytes_transferred)

{
  error_code eCode_00;
  bool bVar1;
  error_category *in_RCX;
  byte in_SIL;
  shared_ptr<void> *in_RDI;
  HttpSession *in_R8;
  error_category *unaff_retaddr;
  HttpSession *in_stack_000000d0;
  shared_ptr<void> *in_stack_ffffffffffffffb0;
  undefined1 *puVar2;
  
  puVar2 = &stack0xffffffffffffffd0;
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe8);
  if (bVar1) {
    eCode_00.cat_ = unaff_retaddr;
    eCode_00._0_8_ = puVar2;
    fail(eCode_00,(char *)in_RCX);
  }
  else if ((in_SIL & 1) == 0) {
    CLI::std::shared_ptr<void>::shared_ptr(in_stack_ffffffffffffffb0,in_RDI);
    CLI::std::shared_ptr<void>::operator=(in_stack_ffffffffffffffb0,in_RDI);
    CLI::std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x301e5f);
    do_read(in_stack_000000d0);
  }
  else {
    do_close(in_R8);
  }
  return;
}

Assistant:

void on_write(bool close, beast::error_code eCode, std::size_t bytes_transferred)
    {
        boost::ignore_unused(bytes_transferred);

        if (eCode) {
            return fail(eCode, "helics web server write");
        }

        if (close) {
            // This means we should close the connection, usually because
            // the response indicated the "Connection: close" semantic.
            return do_close();
        }

        // We're done with the response so delete it
        res = nullptr;

        // Read another request
        do_read();
    }